

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O1

void __thiscall eglu::NativeDisplay::NativeDisplay(NativeDisplay *this,Capability capabilities)

{
  this->_vptr_NativeDisplay = (_func_int **)&PTR__NativeDisplay_003f42a8;
  this->m_capabilities = capabilities;
  this->m_platformType = 0x3038;
  (this->m_platformExtension)._M_dataplus._M_p = (pointer)&(this->m_platformExtension).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_platformExtension,"");
  return;
}

Assistant:

NativeDisplay::NativeDisplay (Capability capabilities)
	: m_capabilities		(capabilities)
	, m_platformType		(EGL_NONE)
	, m_platformExtension	("")
{
	DE_ASSERT(!(capabilities & CAPABILITY_GET_DISPLAY_PLATFORM));
	DE_ASSERT(capabilities & CAPABILITY_GET_DISPLAY_LEGACY);
}